

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_build_parser.cpp
# Opt level: O0

vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
* Omega_h::compute_first_sets
            (vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
             *__return_storage_ptr__,Grammar *grammar,bool verbose)

{
  uint uVar1;
  int symbol_00;
  bool bVar2;
  NodeEdges *pNVar3;
  reference piVar4;
  const_reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  size_type sVar8;
  const_reference pvVar9;
  ostream *poVar10;
  reference piVar11;
  set<int,_std::less<int>,_std::allocator<int>_> *init_val;
  value_type *first_name;
  iterator iStack_250;
  int first_symb;
  _Self local_248;
  _Self local_240;
  iterator it;
  value_type *c;
  value_type *symb_name;
  int symb;
  int local_21c;
  iterator iStack_218;
  int rhs_first_symb;
  iterator __end4;
  iterator __begin4;
  FirstSet *__range4;
  FirstSet rhs_first_set;
  value_type *prod_1;
  iterator iStack_1c0;
  int prod_i_1;
  iterator __end3_1;
  iterator __begin3_1;
  NodeEdges *__range3_1;
  value_type *depender_firsts;
  NodeEdges *prods;
  iterator iStack_190;
  int depender;
  iterator __end2;
  iterator __begin2;
  NodeEdges *__range2;
  NodeEdges *dependers;
  value_type *dependee_firsts;
  int dependee;
  int added_symb;
  value_type event;
  ParserGraph dependees2dependers;
  ParserGraph dependers2dependees;
  value_type *prod;
  iterator iStack_100;
  int prod_i;
  iterator __end3;
  iterator __begin3;
  NodeEdges *__range3;
  NodeEdges *lhs_prods;
  int local_d8;
  int local_d4;
  undefined1 local_d0 [4];
  int symbol;
  ParserGraph lhs2prods;
  set<int,_std::less<int>,_std::allocator<int>_> local_a8;
  byte local_75;
  uint local_74;
  undefined1 local_70 [4];
  int nsymbols;
  queue<Event,_std::deque<Event,_std::allocator<Event>_>_> event_q;
  bool verbose_local;
  Grammar *grammar_local;
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  *first_sets;
  
  init_val = (set<int,_std::less<int>,_std::allocator<int>_> *)__return_storage_ptr__;
  event_q.c.super__Deque_base<Event,_std::allocator<Event>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_node._7_1_ = verbose;
  if (verbose) {
    std::operator<<((ostream *)&std::cerr,"computing FIRST sets...\n");
  }
  std::
  queue<Omega_h::compute_first_sets(Omega_h::Grammar_const&,bool)::Event,std::deque<Omega_h::compute_first_sets(Omega_h::Grammar_const&,bool)::Event,std::allocator<Omega_h::compute_first_sets(Omega_h::Grammar_const&,bool)::Event>>>
  ::
  queue<std::deque<Omega_h::compute_first_sets(Omega_h::Grammar_const&,bool)::Event,std::allocator<Omega_h::compute_first_sets(Omega_h::Grammar_const&,bool)::Event>>,void>
            ((queue<Omega_h::compute_first_sets(Omega_h::Grammar_const&,bool)::Event,std::deque<Omega_h::compute_first_sets(Omega_h::Grammar_const&,bool)::Event,std::allocator<Omega_h::compute_first_sets(Omega_h::Grammar_const&,bool)::Event>>>
              *)local_70);
  uVar1 = grammar->nsymbols;
  local_75 = 0;
  local_a8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_a8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_a8._M_t._M_impl._0_8_ = 0;
  local_a8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_74 = uVar1;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set(&local_a8);
  make_vector<std::set<int,std::less<int>,std::allocator<int>>>
            (__return_storage_ptr__,(Omega_h *)(ulong)uVar1,(int)&local_a8,init_val);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&local_a8);
  get_productions_by_lhs((ParserGraph *)local_d0,grammar);
  local_d4 = 0;
  do {
    if ((int)local_74 <= local_d4) {
      get_symbol_graph((ParserGraph *)
                       &dependees2dependers.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,grammar,
                       (ParserGraph *)local_d0);
      make_transpose((ParserGraph *)&event,
                     (ParserGraph *)
                     &dependees2dependers.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      do {
        do {
          bVar2 = std::queue<Event,_std::deque<Event,_std::allocator<Event>_>_>::empty
                            ((queue<Event,_std::deque<Event,_std::allocator<Event>_>_> *)local_70);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            if ((event_q.c.super__Deque_base<Event,_std::allocator<Event>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node._7_1_ & 1) != 0) {
              for (symb_name._0_4_ = 0; (int)symb_name < (int)local_74;
                  symb_name._0_4_ = (int)symb_name + 1) {
                pvVar9 = at<std::__cxx11::string>(&grammar->symbol_names,(int)symb_name);
                poVar10 = std::operator<<((ostream *)&std::cerr,"FIRST(");
                poVar10 = std::operator<<(poVar10,(string *)pvVar9);
                std::operator<<(poVar10,") = {");
                it._M_node = (_Base_ptr)
                             at<std::set<int,std::less<int>,std::allocator<int>>>
                                       (__return_storage_ptr__,(int)symb_name);
                local_240._M_node =
                     (_Base_ptr)
                     std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                               ((set<int,_std::less<int>,_std::allocator<int>_> *)it._M_node);
                while( true ) {
                  local_248._M_node =
                       (_Base_ptr)
                       std::set<int,_std::less<int>,_std::allocator<int>_>::end(it._M_node);
                  bVar2 = std::operator!=(&local_240,&local_248);
                  if (!bVar2) break;
                  iStack_250 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                                         (it._M_node);
                  bVar2 = std::operator!=(&local_240,&stack0xfffffffffffffdb0);
                  if (bVar2) {
                    std::operator<<((ostream *)&std::cerr,", ");
                  }
                  piVar11 = std::_Rb_tree_const_iterator<int>::operator*(&local_240);
                  if (*piVar11 == -0x1a9) {
                    std::operator<<((ostream *)&std::cerr,"null");
                  }
                  else {
                    pvVar9 = at<std::__cxx11::string>(&grammar->symbol_names,*piVar11);
                    std::operator<<((ostream *)&std::cerr,(string *)pvVar9);
                  }
                  std::_Rb_tree_const_iterator<int>::operator++(&local_240);
                }
                std::operator<<((ostream *)&std::cerr,"}\n");
              }
              std::operator<<((ostream *)&std::cerr,'\n');
            }
            local_75 = 1;
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       *)&event);
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       *)&dependees2dependers.
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       *)local_d0);
            if ((local_75 & 1) == 0) {
              std::
              vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
              ::~vector(__return_storage_ptr__);
            }
            std::queue<Event,_std::deque<Event,_std::allocator<Event>_>_>::~queue
                      ((queue<Event,_std::deque<Event,_std::allocator<Event>_>_> *)local_70);
            return __return_storage_ptr__;
          }
          pvVar6 = std::queue<Event,_std::deque<Event,_std::allocator<Event>_>_>::front
                             ((queue<Event,_std::deque<Event,_std::allocator<Event>_>_> *)local_70);
          _dependee = *pvVar6;
          std::queue<Event,_std::deque<Event,_std::allocator<Event>_>_>::pop
                    ((queue<Event,_std::deque<Event,_std::allocator<Event>_>_> *)local_70);
          dependee_firsts._4_4_ = dependee;
          dependee_firsts._0_4_ = added_symb;
          pvVar7 = at<std::set<int,std::less<int>,std::allocator<int>>>
                             (__return_storage_ptr__,added_symb);
          sVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                            (pvVar7,(key_type *)((long)&dependee_firsts + 4));
        } while (sVar8 != 0);
        std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                  (pvVar7,(value_type_conflict1 *)((long)&dependee_firsts + 4));
        pNVar3 = get_edges((ParserGraph *)&event,(int)dependee_firsts);
        __end2 = std::vector<int,_std::allocator<int>_>::begin(pNVar3);
        iStack_190 = std::vector<int,_std::allocator<int>_>::end(pNVar3);
        while (bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffe70), bVar2) {
          piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&__end2);
          symbol_00 = *piVar4;
          bVar2 = is_nonterminal(grammar,symbol_00);
          if (!bVar2) {
            fail("assertion %s failed at %s +%d\n","is_nonterminal(grammar, depender)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_build_parser.cpp"
                 ,0x13c);
          }
          pNVar3 = get_edges((ParserGraph *)local_d0,symbol_00);
          pvVar7 = at<std::set<int,std::less<int>,std::allocator<int>>>
                             (__return_storage_ptr__,symbol_00);
          __end3_1 = std::vector<int,_std::allocator<int>_>::begin(pNVar3);
          iStack_1c0 = std::vector<int,_std::allocator<int>_>::end(pNVar3);
          while (bVar2 = __gnu_cxx::operator!=(&__end3_1,&stack0xfffffffffffffe40), bVar2) {
            piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&__end3_1);
            rhs_first_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
                 (size_t)at<Omega_h::Grammar::Production>(&grammar->productions,*piVar4);
            get_first_set_of_string
                      ((FirstSet *)&__range4,
                       &((const_reference)
                        rhs_first_set._M_t._M_impl.super__Rb_tree_header._M_node_count)->rhs,
                       __return_storage_ptr__);
            __end4 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                               ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range4);
            iStack_218 = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                                   ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range4);
            while (bVar2 = std::operator!=(&__end4,&stack0xfffffffffffffde8), bVar2) {
              piVar11 = std::_Rb_tree_const_iterator<int>::operator*(&__end4);
              local_21c = *piVar11;
              sVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::count(pvVar7,&local_21c);
              if (sVar8 == 0) {
                symb_name._4_4_ = local_21c;
                symb = symbol_00;
                std::queue<Event,_std::deque<Event,_std::allocator<Event>_>_>::push
                          ((queue<Event,_std::deque<Event,_std::allocator<Event>_>_> *)local_70,
                           (value_type *)((long)&symb_name + 4));
              }
              std::_Rb_tree_const_iterator<int>::operator++(&__end4);
            }
            std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range4);
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                      (&__end3_1);
          }
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end2);
        }
      } while( true );
    }
    bVar2 = is_terminal(grammar,local_d4);
    if (bVar2) {
      lhs_prods._4_4_ = local_d4;
      local_d8 = local_d4;
      std::queue<Event,_std::deque<Event,_std::allocator<Event>_>_>::push
                ((queue<Event,_std::deque<Event,_std::allocator<Event>_>_> *)local_70,
                 (value_type *)((long)&lhs_prods + 4));
    }
    else {
      pNVar3 = get_edges((ParserGraph *)local_d0,local_d4);
      __end3 = std::vector<int,_std::allocator<int>_>::begin(pNVar3);
      iStack_100 = std::vector<int,_std::allocator<int>_>::end(pNVar3);
      while (bVar2 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffff00), bVar2) {
        piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&__end3);
        pvVar5 = at<Omega_h::Grammar::Production>(&grammar->productions,*piVar4);
        bVar2 = std::vector<int,_std::allocator<int>_>::empty(&pvVar5->rhs);
        if (bVar2) {
          dependers2dependees.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0xfffffe57;
          dependers2dependees.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = local_d4;
          std::queue<Event,_std::deque<Event,_std::allocator<Event>_>_>::push
                    ((queue<Event,_std::deque<Event,_std::allocator<Event>_>_> *)local_70,
                     (value_type *)
                     &dependers2dependees.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          break;
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end3);
      }
    }
    local_d4 = local_d4 + 1;
  } while( true );
}

Assistant:

static std::vector<FirstSet> compute_first_sets(
    Grammar const& grammar, bool verbose) {
  if (verbose) std::cerr << "computing FIRST sets...\n";
  struct Event {
    int added_symbol;
    int dependee;
  };
  std::queue<Event> event_q;
  auto nsymbols = grammar.nsymbols;
  auto first_sets = make_vector<FirstSet>(nsymbols);
  auto lhs2prods = get_productions_by_lhs(grammar);
  for (int symbol = 0; symbol < nsymbols; ++symbol) {
    if (is_terminal(grammar, symbol)) {
      event_q.push({symbol, symbol});
    } else {
      auto& lhs_prods = get_edges(lhs2prods, symbol);
      for (auto prod_i : lhs_prods) {
        auto& prod = at(grammar.productions, prod_i);
        if (prod.rhs.empty()) {
          event_q.push({FIRST_NULL, symbol});
          break;
        }
      }
    }
  }
  auto dependers2dependees = get_symbol_graph(grammar, lhs2prods);
  auto dependees2dependers = make_transpose(dependers2dependees);
  while (!event_q.empty()) {
    auto event = event_q.front();
    event_q.pop();
    auto added_symb = event.added_symbol;
    auto dependee = event.dependee;
    auto& dependee_firsts = at(first_sets, dependee);
    /* hopefully we don't get too many duplicate events piled up... */
    if (dependee_firsts.count(added_symb)) continue;
    dependee_firsts.insert(added_symb);
    auto& dependers = get_edges(dependees2dependers, dependee);
    for (auto depender : dependers) {
      OMEGA_H_CHECK(is_nonterminal(grammar, depender));
      auto& prods = get_edges(lhs2prods, depender);
      auto const& depender_firsts = at(first_sets, depender);
      for (auto prod_i : prods) {
        auto& prod = at(grammar.productions, prod_i);
        auto rhs_first_set = get_first_set_of_string(prod.rhs, first_sets);
        for (auto rhs_first_symb : rhs_first_set) {
          if (!depender_firsts.count(rhs_first_symb)) {
            event_q.push({rhs_first_symb, depender});
          }
        }
      }
    }
  }
  if (verbose) {
    for (int symb = 0; symb < nsymbols; ++symb) {
      auto& symb_name = at(grammar.symbol_names, symb);
      std::cerr << "FIRST(" << symb_name << ") = {";
      auto& c = at(first_sets, symb);
      for (auto it = c.begin(); it != c.end(); ++it) {
        if (it != c.begin()) std::cerr << ", ";
        auto first_symb = *it;
        if (first_symb == FIRST_NULL) {
          std::cerr << "null";
        } else {
          auto& first_name = at(grammar.symbol_names, first_symb);
          std::cerr << first_name;
        }
      }
      std::cerr << "}\n";
    }
    std::cerr << '\n';
  }
  return first_sets;
}